

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O2

CoinStatsHashType ParseHashType(string *hash_type_input)

{
  bool bVar1;
  CoinStatsHashType CVar2;
  undefined7 extraout_var;
  UniValue *__return_storage_ptr__;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  long in_FS_OFFSET;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = std::operator==(hash_type_input,"hash_serialized_3");
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (CONCAT71(extraout_var,bVar1) & 0xffffffff);
  CVar2 = HASH_SERIALIZED;
  if ((char)args == '\0') {
    bVar1 = std::operator==(hash_type_input,"muhash");
    if (bVar1) {
      CVar2 = MUHASH;
    }
    else {
      bVar1 = std::operator==(hash_type_input,"none");
      if (!bVar1) {
        __return_storage_ptr__ = (UniValue *)__cxa_allocate_exception(0x58);
        tinyformat::format<std::__cxx11::string>
                  (&local_40,(tinyformat *)"\'%s\' is not a valid hash_type",(char *)hash_type_input
                   ,args);
        JSONRPCError(__return_storage_ptr__,-8,&local_40);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          __cxa_throw(__return_storage_ptr__,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_007d2026;
      }
      CVar2 = NONE;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return CVar2;
  }
LAB_007d2026:
  __stack_chk_fail();
}

Assistant:

CoinStatsHashType ParseHashType(const std::string& hash_type_input)
{
    if (hash_type_input == "hash_serialized_3") {
        return CoinStatsHashType::HASH_SERIALIZED;
    } else if (hash_type_input == "muhash") {
        return CoinStatsHashType::MUHASH;
    } else if (hash_type_input == "none") {
        return CoinStatsHashType::NONE;
    } else {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("'%s' is not a valid hash_type", hash_type_input));
    }
}